

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::solveLleftNoNZ(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  long in_RSI;
  long in_RDI;
  int *rorig;
  int *rbeg;
  int *idx;
  int *ridx;
  double *val;
  double *rval;
  double x;
  int r;
  int k;
  int j;
  int i;
  int *local_48;
  double *local_38;
  int local_18;
  int local_14;
  
  lVar3 = *(long *)(in_RDI + 0xc0);
  pdVar6 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x261641);
  lVar4 = *(long *)(in_RDI + 200);
  lVar5 = *(long *)(in_RDI + 0xd0);
  local_14 = *(int *)(in_RDI + 4);
  while (iVar7 = local_14 + -1, local_14 != 0) {
    iVar2 = *(int *)(lVar5 + (long)iVar7 * 4);
    dVar1 = *(double *)(in_RSI + (long)iVar2 * 8);
    local_14 = iVar7;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar7 = *(int *)(lVar4 + (long)iVar2 * 4);
      local_48 = (int *)(lVar3 + (long)iVar7 * 4);
      local_38 = pdVar6 + iVar7;
      local_18 = *(int *)(lVar4 + (long)(iVar2 + 1) * 4) - iVar7;
      while (0 < local_18) {
        *(double *)(in_RSI + (long)*local_48 * 8) =
             *(double *)(in_RSI + (long)*local_48 * 8) - dVar1 * *local_38;
        local_48 = local_48 + 1;
        local_38 = local_38 + 1;
        local_18 = local_18 + -1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}